

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_double_fast.c
# Opt level: O1

size_t ZSTD_compressBlock_doubleFast_extDict_generic
                 (ZSTD_matchState_t *ms,seqStore_t *seqStore,U32 *rep,void *src,size_t srcSize,
                 U32 mls)

{
  seqDef **ppsVar1;
  long *plVar2;
  ulong *iEnd;
  ulong *puVar3;
  ulong *puVar4;
  ulong *puVar5;
  undefined8 *puVar6;
  ulong *puVar7;
  BYTE *pBVar8;
  U32 *pUVar9;
  BYTE *pBVar10;
  U32 *pUVar11;
  int *piVar12;
  bool bVar13;
  undefined8 uVar14;
  char cVar15;
  char cVar16;
  uint uVar17;
  int iVar18;
  ulong *puVar19;
  size_t sVar20;
  byte bVar21;
  byte bVar22;
  byte bVar23;
  U32 UVar24;
  ulong *puVar25;
  ulong uVar26;
  ulong uVar27;
  BYTE *pBVar28;
  BYTE *pBVar29;
  ulong uVar30;
  U32 *pUVar31;
  ulong *puVar32;
  ulong uVar33;
  BYTE *pBVar34;
  seqDef *psVar35;
  ulong *puVar36;
  seqStore_t *psVar37;
  uint uVar38;
  long lVar39;
  long lVar40;
  uint uVar41;
  uint uVar42;
  int iVar43;
  uint uVar44;
  uint uVar45;
  ulong uVar46;
  BYTE *pBVar47;
  U32 maxDistance;
  uint uVar48;
  BYTE *litEnd_3;
  ulong uVar49;
  ulong *puVar50;
  U32 UVar51;
  ulong *puVar52;
  int iVar53;
  uint uVar54;
  BYTE *litEnd;
  BYTE *litEnd_2;
  ulong *puVar55;
  BYTE *base;
  BYTE *litLimit_w_3;
  U32 hBitsL;
  BYTE *litLimit_w;
  U32 *hashLong;
  U32 *hashSmall;
  BYTE *local_d0;
  int local_b0;
  int local_90;
  
  pUVar9 = ms->hashTable;
  iEnd = (ulong *)((long)src + srcSize);
  pBVar10 = (ms->window).base;
  uVar48 = 1 << ((byte)(ms->cParams).windowLog & 0x1f);
  iVar53 = (int)pBVar10;
  iVar43 = (int)iEnd - iVar53;
  uVar41 = (ms->window).lowLimit;
  uVar45 = uVar41;
  if (uVar48 < iVar43 - uVar41) {
    uVar45 = iVar43 - uVar48;
  }
  UVar24 = ms->loadedDictEnd;
  if (UVar24 != 0) {
    uVar45 = uVar41;
  }
  puVar7 = (ulong *)((long)src + (srcSize - 8));
  pUVar11 = ms->chainTable;
  uVar41 = (ms->window).dictLimit;
  uVar54 = *rep;
  uVar42 = rep[1];
  cVar15 = (char)(ms->cParams).chainLog;
  cVar16 = (char)(ms->cParams).hashLog;
  if (uVar45 < uVar41) {
    puVar55 = (ulong *)src;
    if (src < puVar7) {
      pBVar28 = (ms->window).dictBase;
      puVar3 = (ulong *)(pBVar10 + uVar41);
      puVar4 = (ulong *)(pBVar28 + uVar45);
      puVar5 = (ulong *)(pBVar28 + uVar41);
      bVar21 = 0x20 - cVar15;
      bVar22 = 0x40 - cVar16;
      puVar19 = iEnd + -4;
      ppsVar1 = &seqStore->sequences;
      do {
        uVar48 = mls - 5;
        uVar30 = (ulong)uVar48;
        switch(uVar30) {
        case 0:
          lVar40 = -0x30e4432345000000;
          break;
        case 1:
          lVar40 = -0x30e4432340650000;
          break;
        case 2:
          lVar40 = -0x30e44323405a9d00;
          break;
        case 3:
          uVar26 = *src * -0x30e44323485a9b9d;
          goto LAB_005e2cab;
        default:
          uVar26 = (ulong)((uint)((int)*src * -0x61c8864f) >> (bVar21 & 0x1f));
          goto LAB_005e2cb3;
        }
        uVar26 = lVar40 * *src;
LAB_005e2cab:
        uVar26 = uVar26 >> (0x40U - cVar15 & 0x3f);
LAB_005e2cb3:
        uVar17 = pUVar11[uVar26];
        pBVar29 = pBVar10;
        if (uVar17 < uVar41) {
          pBVar29 = pBVar28;
        }
        uVar27 = *src;
        uVar33 = uVar27 * -0x30e44323485a9b9d >> (bVar22 & 0x3f);
        uVar38 = pUVar9[uVar33];
        pBVar47 = pBVar10;
        if (uVar38 < uVar41) {
          pBVar47 = pBVar28;
        }
        UVar51 = (int)src - iVar53;
        UVar24 = UVar51 + 1;
        uVar44 = UVar24 - uVar54;
        pUVar9[uVar33] = UVar51;
        pBVar34 = pBVar10;
        if (uVar44 < uVar41) {
          pBVar34 = pBVar28;
        }
        pUVar11[uVar26] = UVar51;
        if (((uVar54 < UVar24 - uVar45) && (2 < (uVar41 - 1) - uVar44)) &&
           (*(int *)(pBVar34 + uVar44) == *(int *)((long)src + 1))) {
          puVar50 = (ulong *)((long)src + 1);
          puVar25 = iEnd;
          if (uVar44 < uVar41) {
            puVar25 = puVar5;
          }
          sVar20 = ZSTD_count_2segments
                             ((BYTE *)((long)src + 5),(BYTE *)((long)(pBVar34 + uVar44) + 4),
                              (BYTE *)iEnd,(BYTE *)puVar25,(BYTE *)puVar3);
          uVar27 = (long)puVar50 - (long)puVar55;
          if (puVar19 < puVar50) {
            puVar52 = (ulong *)seqStore->lit;
            puVar25 = puVar52;
            puVar36 = puVar55;
            if (puVar55 <= puVar19) {
              puVar25 = (ulong *)((long)puVar52 + ((long)puVar19 - (long)puVar55));
              uVar26 = puVar55[1];
              *puVar52 = *puVar55;
              puVar52[1] = uVar26;
              puVar36 = puVar19;
              if (0x10 < (long)puVar19 - (long)puVar55) {
                lVar40 = 0x10;
                do {
                  uVar14 = *(undefined8 *)((BYTE *)((long)puVar55 + lVar40) + 8);
                  puVar6 = (undefined8 *)((long)puVar52 + lVar40);
                  *puVar6 = *(undefined8 *)((long)puVar55 + lVar40);
                  puVar6[1] = uVar14;
                  pBVar29 = (BYTE *)((long)puVar55 + lVar40 + 0x10);
                  uVar14 = *(undefined8 *)(pBVar29 + 8);
                  puVar6[2] = *(undefined8 *)pBVar29;
                  puVar6[3] = uVar14;
                  lVar40 = lVar40 + 0x20;
                } while (puVar6 + 4 < puVar25);
              }
            }
            if (puVar36 < puVar50) {
              lVar40 = 0;
              do {
                *(BYTE *)((long)puVar25 + lVar40) = *(BYTE *)((long)puVar36 + lVar40);
                lVar40 = lVar40 + 1;
              } while ((long)puVar50 - (long)puVar36 != lVar40);
            }
          }
          else {
            puVar25 = (ulong *)seqStore->lit;
            uVar26 = puVar55[1];
            *puVar25 = *puVar55;
            puVar25[1] = uVar26;
            if (0x10 < uVar27) {
              pBVar29 = seqStore->lit;
              uVar26 = puVar55[3];
              *(ulong *)(pBVar29 + 0x10) = puVar55[2];
              *(ulong *)(pBVar29 + 0x18) = uVar26;
              if (0x20 < (long)uVar27) {
                lVar40 = 0;
                do {
                  pBVar34 = (BYTE *)((long)puVar55 + lVar40 + 0x20);
                  uVar14 = *(undefined8 *)(pBVar34 + 8);
                  pBVar47 = pBVar29 + lVar40 + 0x20;
                  *(undefined8 *)pBVar47 = *(undefined8 *)pBVar34;
                  *(undefined8 *)(pBVar47 + 8) = uVar14;
                  pBVar34 = (BYTE *)((long)puVar55 + lVar40 + 0x30);
                  uVar14 = *(undefined8 *)(pBVar34 + 8);
                  *(undefined8 *)(pBVar47 + 0x10) = *(undefined8 *)pBVar34;
                  *(undefined8 *)(pBVar47 + 0x18) = uVar14;
                  lVar40 = lVar40 + 0x20;
                } while (pBVar47 + 0x20 < pBVar29 + uVar27);
              }
            }
          }
          seqStore->lit = seqStore->lit + uVar27;
          if (0xffff < uVar27) {
            seqStore->longLengthType = ZSTD_llt_literalLength;
            seqStore->longLengthPos =
                 (U32)((ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart) >> 3);
          }
          lVar40 = sVar20 + 4;
          uVar26 = sVar20 + 1;
          psVar35 = *ppsVar1;
          psVar35->litLength = (U16)uVar27;
          psVar35->offset = 1;
          uVar38 = uVar54;
LAB_005e34d1:
          if (0xffff < uVar26) {
            seqStore->longLengthType = ZSTD_llt_matchLength;
            seqStore->longLengthPos =
                 (U32)((ulong)((long)psVar35 - (long)seqStore->sequencesStart) >> 3);
          }
          src = (void *)(lVar40 + (long)puVar50);
          psVar35->matchLength = (U16)uVar26;
          *ppsVar1 = psVar35 + 1;
          puVar55 = (ulong *)src;
          uVar54 = uVar38;
          if (src <= puVar7) {
            uVar54 = UVar51 + 2;
            pUVar9[(ulong)(*(long *)(pBVar10 + uVar54) * -0x30e44323485a9b9d) >> (bVar22 & 0x3f)] =
                 uVar54;
            pUVar9[(ulong)(*(long *)((long)src + -2) * -0x30e44323485a9b9d) >> (bVar22 & 0x3f)] =
                 ((int)src + -2) - iVar53;
            if (uVar48 < 4) {
              sVar20 = (*(code *)(&DAT_0070d08c + *(int *)(&DAT_0070d08c + uVar30 * 4)))();
              return sVar20;
            }
            pUVar11[(uint)(*(int *)(pBVar10 + uVar54) * -0x61c8864f) >> (bVar21 & 0x1f)] = uVar54;
            if (uVar48 < 4) {
              sVar20 = (*(code *)(&DAT_0070d09c + *(int *)(&DAT_0070d09c + uVar30 * 4)))();
              return sVar20;
            }
            pUVar11[(uint)(*(int *)((long)src + -1) * -0x61c8864f) >> (bVar21 & 0x1f)] =
                 (int)(int *)((long)src + -1) - iVar53;
            do {
              uVar54 = uVar38;
              if (puVar7 < src) break;
              UVar24 = (int)src - iVar53;
              uVar17 = UVar24 - uVar42;
              pBVar29 = pBVar10;
              if (uVar17 < uVar41) {
                pBVar29 = pBVar28;
              }
              if (((uVar42 < UVar24 - uVar45) && (2 < (uVar41 - 1) - uVar17)) &&
                 (*(int *)(pBVar29 + uVar17) == (int)*src)) {
                puVar50 = iEnd;
                if (uVar17 < uVar41) {
                  puVar50 = puVar5;
                }
                sVar20 = ZSTD_count_2segments
                                   ((BYTE *)((long)src + 4),(BYTE *)((long)(pBVar29 + uVar17) + 4),
                                    (BYTE *)iEnd,(BYTE *)puVar50,(BYTE *)puVar3);
                if (puVar55 <= puVar19) {
                  piVar12 = (int *)seqStore->lit;
                  iVar43 = *(int *)((long)puVar55 + 4);
                  uVar26 = puVar55[1];
                  iVar18 = *(int *)((long)puVar55 + 0xc);
                  *piVar12 = (int)*puVar55;
                  piVar12[1] = iVar43;
                  piVar12[2] = (int)uVar26;
                  piVar12[3] = iVar18;
                }
                psVar35 = seqStore->sequences;
                psVar35->litLength = 0;
                psVar35->offset = 1;
                if (0xffff < sVar20 + 1) {
                  seqStore->longLengthType = ZSTD_llt_matchLength;
                  seqStore->longLengthPos =
                       (U32)((ulong)((long)psVar35 - (long)seqStore->sequencesStart) >> 3);
                }
                psVar35->matchLength = (U16)(sVar20 + 1);
                seqStore->sequences = psVar35 + 1;
                if (uVar48 < 4) {
                  sVar20 = (*(code *)(&DAT_0070d0ac + *(int *)(&DAT_0070d0ac + uVar30 * 4)))();
                  return sVar20;
                }
                pUVar11[(uint)((int)*src * -0x61c8864f) >> (bVar21 & 0x1f)] = UVar24;
                pUVar9[*src * -0x30e44323485a9b9d >> (bVar22 & 0x3f)] = UVar24;
                src = (void *)((long)src + sVar20 + 4);
                bVar13 = true;
                puVar55 = (ulong *)src;
                uVar54 = uVar42;
                uVar42 = uVar38;
              }
              else {
                bVar13 = false;
              }
              uVar38 = uVar54;
            } while (bVar13);
          }
        }
        else {
          puVar50 = (ulong *)src;
          if ((uVar45 < uVar38) && (puVar25 = (ulong *)(pBVar47 + uVar38), *puVar25 == uVar27)) {
            puVar36 = puVar3;
            puVar52 = iEnd;
            if (uVar38 < uVar41) {
              puVar36 = puVar4;
              puVar52 = puVar5;
            }
            sVar20 = ZSTD_count_2segments
                               ((BYTE *)((long)src + 8),(BYTE *)(puVar25 + 1),(BYTE *)iEnd,
                                (BYTE *)puVar52,(BYTE *)puVar3);
            lVar40 = sVar20 + 8;
            if ((puVar36 < puVar25) && (puVar55 < src)) {
              puVar25 = (ulong *)(pBVar47 + uVar38);
              do {
                puVar52 = (ulong *)((long)src + -1);
                puVar25 = (ulong *)((long)puVar25 + -1);
                puVar50 = (ulong *)src;
                if ((*(BYTE *)puVar52 != *(BYTE *)puVar25) ||
                   (lVar40 = lVar40 + 1, puVar50 = puVar52, puVar25 <= puVar36)) break;
                src = puVar52;
              } while (puVar55 < puVar52);
            }
            uVar26 = (long)puVar50 - (long)puVar55;
            if (puVar19 < puVar50) {
              puVar52 = (ulong *)seqStore->lit;
              puVar25 = puVar52;
              puVar36 = puVar55;
              if (puVar55 <= puVar19) {
                puVar25 = (ulong *)((long)puVar52 + ((long)puVar19 - (long)puVar55));
                uVar27 = puVar55[1];
                *puVar52 = *puVar55;
                puVar52[1] = uVar27;
                puVar36 = puVar19;
                if (0x10 < (long)puVar19 - (long)puVar55) {
                  lVar39 = 0x10;
                  do {
                    uVar14 = *(undefined8 *)((BYTE *)((long)puVar55 + lVar39) + 8);
                    puVar6 = (undefined8 *)((long)puVar52 + lVar39);
                    *puVar6 = *(undefined8 *)((long)puVar55 + lVar39);
                    puVar6[1] = uVar14;
                    pBVar29 = (BYTE *)((long)puVar55 + lVar39 + 0x10);
                    uVar14 = *(undefined8 *)(pBVar29 + 8);
                    puVar6[2] = *(undefined8 *)pBVar29;
                    puVar6[3] = uVar14;
                    lVar39 = lVar39 + 0x20;
                  } while (puVar6 + 4 < puVar25);
                }
              }
              if (puVar36 < puVar50) {
                lVar39 = 0;
                do {
                  *(BYTE *)((long)puVar25 + lVar39) = *(BYTE *)((long)puVar36 + lVar39);
                  lVar39 = lVar39 + 1;
                } while ((long)puVar50 - (long)puVar36 != lVar39);
              }
            }
            else {
              puVar25 = (ulong *)seqStore->lit;
              uVar27 = puVar55[1];
              *puVar25 = *puVar55;
              puVar25[1] = uVar27;
              if (0x10 < uVar26) {
                pBVar29 = seqStore->lit;
                uVar27 = puVar55[3];
                *(ulong *)(pBVar29 + 0x10) = puVar55[2];
                *(ulong *)(pBVar29 + 0x18) = uVar27;
                if (0x20 < (long)uVar26) {
                  lVar39 = 0;
                  do {
                    pBVar34 = (BYTE *)((long)puVar55 + lVar39 + 0x20);
                    uVar14 = *(undefined8 *)(pBVar34 + 8);
                    pBVar47 = pBVar29 + lVar39 + 0x20;
                    *(undefined8 *)pBVar47 = *(undefined8 *)pBVar34;
                    *(undefined8 *)(pBVar47 + 8) = uVar14;
                    pBVar34 = (BYTE *)((long)puVar55 + lVar39 + 0x30);
                    uVar14 = *(undefined8 *)(pBVar34 + 8);
                    *(undefined8 *)(pBVar47 + 0x10) = *(undefined8 *)pBVar34;
                    *(undefined8 *)(pBVar47 + 0x18) = uVar14;
                    lVar39 = lVar39 + 0x20;
                  } while (pBVar47 + 0x20 < pBVar29 + uVar26);
                }
              }
            }
            seqStore->lit = seqStore->lit + uVar26;
            if (0xffff < uVar26) {
              seqStore->longLengthType = ZSTD_llt_literalLength;
              seqStore->longLengthPos =
                   (U32)((ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart) >> 3);
            }
            uVar38 = UVar51 - uVar38;
            psVar35 = *ppsVar1;
            psVar35->litLength = (U16)uVar26;
LAB_005e34c5:
            uVar26 = lVar40 - 3;
            psVar35->offset = uVar38 + 3;
            uVar42 = uVar54;
            goto LAB_005e34d1;
          }
          if ((uVar45 < uVar17) &&
             (puVar25 = (ulong *)(pBVar29 + uVar17), (int)*puVar25 == (int)*src)) {
            uVar26 = *(ulong *)((long)src + 1);
            uVar27 = uVar26 * -0x30e44323485a9b9d >> (bVar22 & 0x3f);
            uVar42 = pUVar9[uVar27];
            pBVar47 = pBVar10;
            if (uVar42 < uVar41) {
              pBVar47 = pBVar28;
            }
            pUVar9[uVar27] = UVar24;
            if ((uVar45 < uVar42) && (puVar52 = (ulong *)(pBVar47 + uVar42), *puVar52 == uVar26)) {
              puVar50 = (ulong *)((long)src + 1);
              puVar36 = puVar3;
              puVar25 = iEnd;
              if (uVar42 < uVar41) {
                puVar36 = puVar4;
                puVar25 = puVar5;
              }
              sVar20 = ZSTD_count_2segments
                                 ((BYTE *)((long)src + 9),(BYTE *)(puVar52 + 1),(BYTE *)iEnd,
                                  (BYTE *)puVar25,(BYTE *)puVar3);
              lVar40 = sVar20 + 8;
              uVar38 = UVar24 - uVar42;
              if ((puVar36 < puVar52) && (puVar55 < puVar50)) {
                puVar25 = (ulong *)(pBVar47 + uVar42);
                while (puVar50 = (ulong *)src, puVar25 = (ulong *)((long)puVar25 + -1),
                      (BYTE)*puVar50 == *(BYTE *)puVar25) {
                  lVar40 = lVar40 + 1;
                  if ((puVar25 <= puVar36) ||
                     (src = (ulong *)((long)puVar50 + -1), puVar50 <= puVar55)) goto LAB_005e33a8;
                }
                puVar50 = (ulong *)((long)puVar50 + 1);
              }
            }
            else {
              puVar36 = puVar3;
              puVar52 = iEnd;
              if (uVar17 < uVar41) {
                puVar36 = puVar4;
                puVar52 = puVar5;
              }
              sVar20 = ZSTD_count_2segments
                                 ((BYTE *)((long)src + 4),(BYTE *)((long)puVar25 + 4),(BYTE *)iEnd,
                                  (BYTE *)puVar52,(BYTE *)puVar3);
              lVar40 = sVar20 + 4;
              uVar38 = UVar51 - uVar17;
              if ((puVar36 < puVar25) && (puVar55 < src)) {
                puVar25 = (ulong *)(pBVar29 + uVar17);
                do {
                  puVar52 = (ulong *)((long)src + -1);
                  puVar25 = (ulong *)((long)puVar25 + -1);
                  puVar50 = (ulong *)src;
                  if ((*(BYTE *)puVar52 != *(BYTE *)puVar25) ||
                     (lVar40 = lVar40 + 1, puVar50 = puVar52, puVar25 <= puVar36)) break;
                  src = puVar52;
                } while (puVar55 < puVar52);
              }
            }
LAB_005e33a8:
            uVar26 = (long)puVar50 - (long)puVar55;
            if (puVar19 < puVar50) {
              puVar52 = (ulong *)seqStore->lit;
              puVar25 = puVar52;
              puVar36 = puVar55;
              if (puVar55 <= puVar19) {
                puVar25 = (ulong *)((long)puVar52 + ((long)puVar19 - (long)puVar55));
                uVar27 = puVar55[1];
                *puVar52 = *puVar55;
                puVar52[1] = uVar27;
                puVar36 = puVar19;
                if (0x10 < (long)puVar19 - (long)puVar55) {
                  lVar39 = 0x10;
                  do {
                    uVar14 = *(undefined8 *)((BYTE *)((long)puVar55 + lVar39) + 8);
                    puVar6 = (undefined8 *)((long)puVar52 + lVar39);
                    *puVar6 = *(undefined8 *)((long)puVar55 + lVar39);
                    puVar6[1] = uVar14;
                    pBVar29 = (BYTE *)((long)puVar55 + lVar39 + 0x10);
                    uVar14 = *(undefined8 *)(pBVar29 + 8);
                    puVar6[2] = *(undefined8 *)pBVar29;
                    puVar6[3] = uVar14;
                    lVar39 = lVar39 + 0x20;
                  } while (puVar6 + 4 < puVar25);
                }
              }
              if (puVar36 < puVar50) {
                lVar39 = 0;
                do {
                  *(BYTE *)((long)puVar25 + lVar39) = *(BYTE *)((long)puVar36 + lVar39);
                  lVar39 = lVar39 + 1;
                } while ((long)puVar50 - (long)puVar36 != lVar39);
              }
            }
            else {
              puVar25 = (ulong *)seqStore->lit;
              uVar27 = puVar55[1];
              *puVar25 = *puVar55;
              puVar25[1] = uVar27;
              if (0x10 < uVar26) {
                pBVar29 = seqStore->lit;
                uVar27 = puVar55[3];
                *(ulong *)(pBVar29 + 0x10) = puVar55[2];
                *(ulong *)(pBVar29 + 0x18) = uVar27;
                if (0x20 < (long)uVar26) {
                  lVar39 = 0;
                  do {
                    pBVar34 = (BYTE *)((long)puVar55 + lVar39 + 0x20);
                    uVar14 = *(undefined8 *)(pBVar34 + 8);
                    pBVar47 = pBVar29 + lVar39 + 0x20;
                    *(undefined8 *)pBVar47 = *(undefined8 *)pBVar34;
                    *(undefined8 *)(pBVar47 + 8) = uVar14;
                    pBVar34 = (BYTE *)((long)puVar55 + lVar39 + 0x30);
                    uVar14 = *(undefined8 *)(pBVar34 + 8);
                    *(undefined8 *)(pBVar47 + 0x10) = *(undefined8 *)pBVar34;
                    *(undefined8 *)(pBVar47 + 0x18) = uVar14;
                    lVar39 = lVar39 + 0x20;
                  } while (pBVar47 + 0x20 < pBVar29 + uVar26);
                }
              }
            }
            seqStore->lit = seqStore->lit + uVar26;
            if (0xffff < uVar26) {
              seqStore->longLengthType = ZSTD_llt_literalLength;
              seqStore->longLengthPos =
                   (U32)((ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart) >> 3);
            }
            psVar35 = *ppsVar1;
            psVar35->litLength = (U16)uVar26;
            goto LAB_005e34c5;
          }
          src = (void *)((long)src + ((long)src - (long)puVar55 >> 8) + 1);
        }
      } while (src < puVar7);
    }
    src = puVar55;
    *rep = uVar54;
  }
  else {
    uVar45 = iVar43 - uVar48;
    if (iVar43 - uVar41 <= uVar48) {
      uVar45 = uVar41;
    }
    if (UVar24 != 0) {
      uVar45 = uVar41;
    }
    pBVar28 = pBVar10 + uVar45;
    puVar55 = (ulong *)((ulong)((int)src == (int)pBVar28) + (long)src);
    iVar43 = (int)puVar55 - iVar53;
    uVar17 = iVar43 - uVar48;
    if (iVar43 - uVar41 <= uVar48) {
      uVar17 = uVar41;
    }
    if (UVar24 != 0) {
      uVar17 = uVar41;
    }
    uVar17 = iVar43 - uVar17;
    uVar41 = 0;
    if (uVar17 < uVar42) {
      uVar41 = uVar42;
    }
    uVar30 = (ulong)uVar42;
    if (uVar17 < uVar42) {
      uVar30 = 0;
    }
    uVar42 = (uint)uVar30;
    uVar48 = uVar54;
    if (uVar17 < uVar54) {
      uVar48 = 0;
      uVar41 = uVar54;
    }
    uVar26 = (ulong)uVar48;
    if (puVar55 < puVar7) {
      bVar21 = 0x40 - cVar16;
      bVar22 = 0x40 - cVar15;
      bVar23 = 0x20 - cVar15;
      puVar3 = (ulong *)((long)iEnd - 7);
      puVar4 = (ulong *)((long)iEnd - 3);
      puVar5 = (ulong *)((long)iEnd - 1);
      puVar19 = iEnd + -4;
      ppsVar1 = &seqStore->sequences;
      pBVar29 = pBVar10 + -1;
      psVar37 = seqStore;
      local_d0 = pBVar29;
LAB_005e3924:
      uVar27 = *puVar55;
      uVar49 = uVar27 * -0x30e44323485a9b9d;
      uVar33 = uVar49 >> (bVar21 & 0x3f);
      iVar43 = mls - 5;
      switch(iVar43) {
      case 0:
        lVar40 = -0x30e4432345000000;
        break;
      case 1:
        lVar40 = -0x30e4432340650000;
        break;
      case 2:
        lVar40 = -0x30e44323405a9d00;
        break;
      case 3:
        goto switchD_005e3962_caseD_3;
      default:
        uVar49 = (ulong)((uint)((int)*puVar55 * -0x61c8864f) >> (bVar23 & 0x1f));
        goto LAB_005e3989;
      }
      uVar49 = lVar40 * uVar27;
switchD_005e3962_caseD_3:
      uVar49 = uVar49 >> (bVar22 & 0x3f);
LAB_005e3989:
      UVar24 = (int)puVar55 - iVar53;
      uVar48 = pUVar9[uVar33];
      uVar54 = pUVar11[uVar49];
      pUVar11[uVar49] = UVar24;
      pUVar9[uVar33] = UVar24;
      puVar50 = (ulong *)((long)puVar55 + 1);
      uVar42 = (uint)uVar26;
      if ((uVar42 != 0) && (*(int *)((long)puVar50 - uVar26) == *(int *)((long)puVar55 + 1))) {
        puVar25 = (ulong *)((long)puVar55 + 5);
        puVar36 = (ulong *)((long)puVar55 + (5 - uVar26));
        puVar52 = puVar25;
        if (puVar25 < puVar3) {
          uVar33 = *puVar25 ^ *puVar36;
          uVar27 = 0;
          if (uVar33 != 0) {
            for (; (uVar33 >> uVar27 & 1) == 0; uVar27 = uVar27 + 1) {
            }
          }
          pUVar31 = (U32 *)(uVar27 >> 3 & 0x1fffffff);
          if (*puVar36 == *puVar25) {
            puVar52 = (ulong *)((long)puVar55 + 0xd);
            puVar36 = (ulong *)((long)puVar55 + (0xd - uVar26));
            do {
              if (puVar3 <= puVar52) goto LAB_005e3c1f;
              uVar27 = *puVar36;
              uVar33 = *puVar52;
              uVar46 = uVar33 ^ uVar27;
              uVar49 = 0;
              if (uVar46 != 0) {
                for (; (uVar46 >> uVar49 & 1) == 0; uVar49 = uVar49 + 1) {
                }
              }
              pUVar31 = (U32 *)((long)puVar52 + ((uVar49 >> 3 & 0x1fffffff) - (long)puVar25));
              puVar52 = puVar52 + 1;
              puVar36 = puVar36 + 1;
            } while (uVar27 == uVar33);
          }
        }
        else {
LAB_005e3c1f:
          if ((puVar52 < puVar4) && ((int)*puVar36 == (int)*puVar52)) {
            puVar52 = (ulong *)((long)puVar52 + 4);
            puVar36 = (ulong *)((long)puVar36 + 4);
          }
          if ((puVar52 < puVar5) && ((short)*puVar36 == (short)*puVar52)) {
            puVar52 = (ulong *)((long)puVar52 + 2);
            puVar36 = (ulong *)((long)puVar36 + 2);
          }
          if (puVar52 < iEnd) {
            puVar52 = (ulong *)((long)puVar52 + (ulong)((BYTE)*puVar36 == (BYTE)*puVar52));
          }
          pUVar31 = (U32 *)((long)puVar52 - (long)puVar25);
        }
        uVar27 = (long)puVar50 - (long)src;
        if (puVar19 < puVar50) {
          puVar25 = (ulong *)seqStore->lit;
          puVar55 = puVar25;
          puVar52 = (ulong *)src;
          if (src <= puVar19) {
            puVar55 = (ulong *)((long)puVar25 + ((long)puVar19 - (long)src));
            uVar33 = *(ulong *)((long)src + 8);
            *puVar25 = *src;
            puVar25[1] = uVar33;
            puVar52 = puVar19;
            if (0x10 < (long)puVar19 - (long)src) {
              lVar40 = 0x10;
              do {
                uVar14 = *(undefined8 *)((BYTE *)((long)src + lVar40) + 8);
                puVar6 = (undefined8 *)((long)puVar25 + lVar40);
                *puVar6 = *(undefined8 *)((long)src + lVar40);
                puVar6[1] = uVar14;
                pBVar47 = (BYTE *)((long)src + lVar40 + 0x10);
                uVar14 = *(undefined8 *)(pBVar47 + 8);
                puVar6[2] = *(undefined8 *)pBVar47;
                puVar6[3] = uVar14;
                lVar40 = lVar40 + 0x20;
              } while (puVar6 + 4 < puVar55);
            }
          }
          if (puVar52 < puVar50) {
            lVar40 = 0;
            do {
              *(BYTE *)((long)puVar55 + lVar40) = *(BYTE *)((long)puVar52 + lVar40);
              lVar40 = lVar40 + 1;
            } while ((long)puVar50 - (long)puVar52 != lVar40);
          }
        }
        else {
          puVar55 = (ulong *)seqStore->lit;
          uVar33 = *(ulong *)((long)src + 8);
          *puVar55 = *src;
          puVar55[1] = uVar33;
          if (0x10 < uVar27) {
            pBVar47 = seqStore->lit;
            uVar33 = *(ulong *)((long)src + 0x18);
            *(ulong *)(pBVar47 + 0x10) = *(ulong *)((long)src + 0x10);
            *(ulong *)(pBVar47 + 0x18) = uVar33;
            if (0x20 < (long)uVar27) {
              lVar40 = 0;
              do {
                pBVar8 = (BYTE *)((long)src + lVar40 + 0x20);
                uVar14 = *(undefined8 *)(pBVar8 + 8);
                pBVar34 = pBVar47 + lVar40 + 0x20;
                *(undefined8 *)pBVar34 = *(undefined8 *)pBVar8;
                *(undefined8 *)(pBVar34 + 8) = uVar14;
                pBVar8 = (BYTE *)((long)src + lVar40 + 0x30);
                uVar14 = *(undefined8 *)(pBVar8 + 8);
                *(undefined8 *)(pBVar34 + 0x10) = *(undefined8 *)pBVar8;
                *(undefined8 *)(pBVar34 + 0x18) = uVar14;
                lVar40 = lVar40 + 0x20;
              } while (pBVar34 + 0x20 < pBVar47 + uVar27);
            }
          }
        }
        seqStore->lit = seqStore->lit + uVar27;
        if (0xffff < uVar27) {
          seqStore->longLengthType = ZSTD_llt_literalLength;
          seqStore->longLengthPos =
               (U32)((ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart) >> 3);
        }
        psVar37 = (seqStore_t *)(pUVar31 + 1);
        psVar35 = *ppsVar1;
        psVar35->litLength = (U16)uVar27;
        psVar35->offset = 1;
        puVar55 = puVar50;
        goto joined_r0x005e3eb2;
      }
      if ((uVar45 < uVar48) && (puVar25 = (ulong *)(pBVar10 + uVar48), *puVar25 == uVar27)) {
        puVar50 = puVar55 + 1;
        puVar36 = puVar25 + 1;
        puVar52 = puVar50;
        if (puVar50 < puVar3) {
          uVar27 = *puVar50 ^ *puVar36;
          uVar30 = 0;
          if (uVar27 != 0) {
            for (; (uVar27 >> uVar30 & 1) == 0; uVar30 = uVar30 + 1) {
            }
          }
          pBVar47 = (BYTE *)(uVar30 >> 3 & 0x1fffffff);
          if (*puVar36 == *puVar50) {
            puVar52 = puVar55 + 2;
            puVar36 = puVar25 + 2;
            do {
              if (puVar3 <= puVar52) goto LAB_005e3ddf;
              uVar30 = *puVar36;
              uVar27 = *puVar52;
              uVar49 = uVar27 ^ uVar30;
              uVar33 = 0;
              if (uVar49 != 0) {
                for (; (uVar49 >> uVar33 & 1) == 0; uVar33 = uVar33 + 1) {
                }
              }
              pBVar47 = (BYTE *)((long)puVar52 + ((uVar33 >> 3 & 0x1fffffff) - (long)puVar50));
              puVar52 = puVar52 + 1;
              puVar36 = puVar36 + 1;
            } while (uVar30 == uVar27);
          }
        }
        else {
LAB_005e3ddf:
          if ((puVar52 < puVar4) && ((int)*puVar36 == (int)*puVar52)) {
            puVar52 = (ulong *)((long)puVar52 + 4);
            puVar36 = (ulong *)((long)puVar36 + 4);
          }
          if ((puVar52 < puVar5) && ((short)*puVar36 == (short)*puVar52)) {
            puVar52 = (ulong *)((long)puVar52 + 2);
            puVar36 = (ulong *)((long)puVar36 + 2);
          }
          if (puVar52 < iEnd) {
            puVar52 = (ulong *)((long)puVar52 + (ulong)((BYTE)*puVar36 == (BYTE)*puVar52));
          }
          pBVar47 = (BYTE *)((long)puVar52 - (long)puVar50);
        }
        psVar37 = (seqStore_t *)(pBVar47 + 8);
        local_d0 = (BYTE *)(ulong)(uint)((int)puVar55 - (int)puVar25);
        if ((uVar45 < uVar48) && (src < puVar55)) {
          pBVar47 = pBVar29 + uVar48;
          puVar50 = (ulong *)((long)puVar55 + -1);
          do {
            if ((BYTE)*puVar50 != *pBVar47) goto LAB_005e43d3;
            psVar37 = (seqStore_t *)((long)&psVar37->sequencesStart + 1);
            puVar55 = (ulong *)((long)puVar50 + -1);
          } while ((pBVar28 < pBVar47) &&
                  (pBVar47 = pBVar47 + -1, bVar13 = src < puVar50, puVar50 = puVar55, bVar13));
LAB_005e4316:
          puVar55 = (ulong *)((long)puVar55 + 1);
        }
        goto LAB_005e43d9;
      }
      if ((uVar45 < uVar54) && (piVar12 = (int *)(pBVar10 + uVar54), *piVar12 == (int)*puVar55)) {
        uVar27 = *puVar50;
        uVar33 = uVar27 * -0x30e44323485a9b9d >> (bVar21 & 0x3f);
        uVar48 = pUVar9[uVar33];
        pUVar9[uVar33] = UVar24 + 1;
        iVar18 = 0;
        puVar25 = puVar55;
        if ((uVar45 < uVar48) && (puVar52 = (ulong *)(pBVar10 + uVar48), *puVar52 == uVar27)) {
          puVar25 = (ulong *)((long)puVar55 + 9);
          puVar36 = puVar52 + 1;
          puVar32 = puVar25;
          if (puVar25 < puVar3) {
            uVar33 = *puVar25 ^ *puVar36;
            uVar27 = 0;
            if (uVar33 != 0) {
              for (; (uVar33 >> uVar27 & 1) == 0; uVar27 = uVar27 + 1) {
              }
            }
            pBVar47 = (BYTE *)(uVar27 >> 3 & 0x1fffffff);
            if (*puVar36 == *puVar25) {
              puVar32 = (ulong *)((long)puVar55 + 0x11);
              puVar36 = puVar52 + 2;
              do {
                if (puVar3 <= puVar32) goto LAB_005e4519;
                uVar27 = *puVar36;
                uVar33 = *puVar32;
                uVar46 = uVar33 ^ uVar27;
                uVar49 = 0;
                if (uVar46 != 0) {
                  for (; (uVar46 >> uVar49 & 1) == 0; uVar49 = uVar49 + 1) {
                  }
                }
                pBVar47 = (BYTE *)((long)puVar32 + ((uVar49 >> 3 & 0x1fffffff) - (long)puVar25));
                puVar32 = puVar32 + 1;
                puVar36 = puVar36 + 1;
              } while (uVar27 == uVar33);
            }
          }
          else {
LAB_005e4519:
            if ((puVar32 < puVar4) && ((int)*puVar36 == (int)*puVar32)) {
              puVar32 = (ulong *)((long)puVar32 + 4);
              puVar36 = (ulong *)((long)puVar36 + 4);
            }
            if ((puVar32 < puVar5) && ((short)*puVar36 == (short)*puVar32)) {
              puVar32 = (ulong *)((long)puVar32 + 2);
              puVar36 = (ulong *)((long)puVar36 + 2);
            }
            if (puVar32 < iEnd) {
              puVar32 = (ulong *)((long)puVar32 + (ulong)((BYTE)*puVar36 == (BYTE)*puVar32));
            }
            pBVar47 = (BYTE *)((long)puVar32 - (long)puVar25);
          }
          psVar37 = (seqStore_t *)(pBVar47 + 8);
          local_90 = (int)puVar52;
          local_d0 = (BYTE *)(ulong)(uint)((int)puVar50 - local_90);
          iVar18 = 7;
          puVar25 = puVar50;
          if ((uVar45 < uVar48) && (src < puVar50)) {
            pBVar47 = pBVar29 + uVar48;
            while (puVar25 = puVar55, (BYTE)*puVar25 == *pBVar47) {
              psVar37 = (seqStore_t *)((long)&psVar37->sequencesStart + 1);
              if ((pBVar47 <= pBVar28) ||
                 (pBVar47 = pBVar47 + -1, puVar55 = (ulong *)((long)puVar25 + -1), puVar25 <= src))
              goto LAB_005e3d34;
            }
            puVar25 = (ulong *)((long)puVar25 + 1);
          }
        }
LAB_005e3d34:
        puVar55 = puVar25;
        if (iVar18 != 7) {
          if (iVar18 != 0) goto LAB_005e4258;
          puVar50 = (ulong *)((long)puVar55 + 4);
          puVar52 = (ulong *)(piVar12 + 1);
          puVar25 = puVar50;
          if (puVar50 < puVar3) {
            uVar27 = *puVar50 ^ *puVar52;
            uVar30 = 0;
            if (uVar27 != 0) {
              for (; (uVar27 >> uVar30 & 1) == 0; uVar30 = uVar30 + 1) {
              }
            }
            pBVar47 = (BYTE *)(uVar30 >> 3 & 0x1fffffff);
            if (*puVar52 == *puVar50) {
              puVar25 = (ulong *)((long)puVar55 + 0xc);
              puVar52 = (ulong *)(piVar12 + 3);
              do {
                if (puVar3 <= puVar25) goto LAB_005e4333;
                uVar30 = *puVar52;
                uVar27 = *puVar25;
                uVar49 = uVar27 ^ uVar30;
                uVar33 = 0;
                if (uVar49 != 0) {
                  for (; (uVar49 >> uVar33 & 1) == 0; uVar33 = uVar33 + 1) {
                  }
                }
                pBVar47 = (BYTE *)((long)puVar25 + ((uVar33 >> 3 & 0x1fffffff) - (long)puVar50));
                puVar25 = puVar25 + 1;
                puVar52 = puVar52 + 1;
              } while (uVar30 == uVar27);
            }
          }
          else {
LAB_005e4333:
            if ((puVar25 < puVar4) && ((int)*puVar52 == (int)*puVar25)) {
              puVar25 = (ulong *)((long)puVar25 + 4);
              puVar52 = (ulong *)((long)puVar52 + 4);
            }
            if ((puVar25 < puVar5) && ((short)*puVar52 == (short)*puVar25)) {
              puVar25 = (ulong *)((long)puVar25 + 2);
              puVar52 = (ulong *)((long)puVar52 + 2);
            }
            if (puVar25 < iEnd) {
              puVar25 = (ulong *)((long)puVar25 + (ulong)((BYTE)*puVar52 == (BYTE)*puVar25));
            }
            pBVar47 = (BYTE *)((long)puVar25 - (long)puVar50);
          }
          psVar37 = (seqStore_t *)(pBVar47 + 4);
          local_b0 = (int)piVar12;
          local_d0 = (BYTE *)(ulong)(uint)((int)puVar55 - local_b0);
          if ((uVar45 < uVar54) && (src < puVar55)) {
            pBVar47 = pBVar29 + uVar54;
            puVar50 = (ulong *)((long)puVar55 + -1);
            do {
              if ((BYTE)*puVar50 != *pBVar47) goto LAB_005e43d3;
              psVar37 = (seqStore_t *)((long)&psVar37->sequencesStart + 1);
              puVar55 = (ulong *)((long)puVar50 + -1);
            } while ((pBVar28 < pBVar47) &&
                    (pBVar47 = pBVar47 + -1, bVar13 = src < puVar50, puVar50 = puVar55, bVar13));
            goto LAB_005e4316;
          }
        }
        goto LAB_005e43d9;
      }
      puVar55 = (ulong *)((long)puVar55 + ((long)puVar55 - (long)src >> 8) + 1);
      goto LAB_005e4258;
    }
LAB_005e45d4:
    if (uVar48 == 0) {
      uVar48 = uVar41;
    }
    *rep = uVar48;
    if (uVar42 == 0) {
      uVar42 = uVar41;
    }
  }
  rep[1] = uVar42;
  return (long)iEnd - (long)src;
LAB_005e43d3:
  puVar55 = (ulong *)((long)puVar50 + 1);
LAB_005e43d9:
  uVar30 = (long)puVar55 - (long)src;
  if (puVar19 < puVar55) {
    puVar25 = (ulong *)seqStore->lit;
    puVar50 = puVar25;
    puVar52 = (ulong *)src;
    if (src <= puVar19) {
      puVar50 = (ulong *)((long)puVar25 + ((long)puVar19 - (long)src));
      uVar27 = *(ulong *)((long)src + 8);
      *puVar25 = *src;
      puVar25[1] = uVar27;
      puVar52 = puVar19;
      if (0x10 < (long)puVar19 - (long)src) {
        lVar40 = 0x10;
        do {
          uVar14 = *(undefined8 *)((BYTE *)((long)src + lVar40) + 8);
          puVar6 = (undefined8 *)((long)puVar25 + lVar40);
          *puVar6 = *(undefined8 *)((long)src + lVar40);
          puVar6[1] = uVar14;
          pBVar47 = (BYTE *)((long)src + lVar40 + 0x10);
          uVar14 = *(undefined8 *)(pBVar47 + 8);
          puVar6[2] = *(undefined8 *)pBVar47;
          puVar6[3] = uVar14;
          lVar40 = lVar40 + 0x20;
        } while (puVar6 + 4 < puVar50);
      }
    }
    if (puVar52 < puVar55) {
      lVar40 = 0;
      do {
        *(BYTE *)((long)puVar50 + lVar40) = *(BYTE *)((long)puVar52 + lVar40);
        lVar40 = lVar40 + 1;
      } while ((long)puVar55 - (long)puVar52 != lVar40);
    }
  }
  else {
    puVar50 = (ulong *)seqStore->lit;
    uVar27 = *(ulong *)((long)src + 8);
    *puVar50 = *src;
    puVar50[1] = uVar27;
    if (0x10 < uVar30) {
      pBVar47 = seqStore->lit;
      uVar27 = *(ulong *)((long)src + 0x18);
      *(ulong *)(pBVar47 + 0x10) = *(ulong *)((long)src + 0x10);
      *(ulong *)(pBVar47 + 0x18) = uVar27;
      if (0x20 < (long)uVar30) {
        lVar40 = 0;
        do {
          pBVar8 = (BYTE *)((long)src + lVar40 + 0x20);
          uVar14 = *(undefined8 *)(pBVar8 + 8);
          pBVar34 = pBVar47 + lVar40 + 0x20;
          *(undefined8 *)pBVar34 = *(undefined8 *)pBVar8;
          *(undefined8 *)(pBVar34 + 8) = uVar14;
          pBVar8 = (BYTE *)((long)src + lVar40 + 0x30);
          uVar14 = *(undefined8 *)(pBVar8 + 8);
          *(undefined8 *)(pBVar34 + 0x10) = *(undefined8 *)pBVar8;
          *(undefined8 *)(pBVar34 + 0x18) = uVar14;
          lVar40 = lVar40 + 0x20;
        } while (pBVar34 + 0x20 < pBVar47 + uVar30);
      }
    }
  }
  seqStore->lit = seqStore->lit + uVar30;
  if (0xffff < uVar30) {
    seqStore->longLengthType = ZSTD_llt_literalLength;
    seqStore->longLengthPos =
         (U32)((ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart) >> 3);
  }
  pUVar31 = &psVar37[-1].longLengthPos;
  psVar35 = *ppsVar1;
  psVar35->litLength = (U16)uVar30;
  uVar42 = (uint)local_d0;
  psVar35->offset = uVar42 + 3;
  uVar30 = uVar26;
  uVar26 = (ulong)local_d0 & 0xffffffff;
joined_r0x005e3eb2:
  if ((BYTE *)0xffff < (BYTE *)((long)pUVar31 + 1)) {
    seqStore->longLengthType = ZSTD_llt_matchLength;
    seqStore->longLengthPos = (U32)((ulong)((long)psVar35 - (long)seqStore->sequencesStart) >> 3);
    uVar26 = (ulong)uVar42;
  }
  psVar35->matchLength = (U16)(BYTE *)((long)pUVar31 + 1);
  *ppsVar1 = psVar35 + 1;
  src = (void *)((long)puVar55 + (long)psVar37);
  puVar55 = (ulong *)src;
  if (puVar7 < src) goto LAB_005e4258;
  uVar48 = UVar24 + 2;
  lVar40 = *(long *)(pBVar10 + uVar48);
  uVar27 = lVar40 * -0x30e44323485a9b9d;
  pUVar9[uVar27 >> (bVar21 & 0x3f)] = uVar48;
  pUVar9[(ulong)(*(long *)((long)src + -2) * -0x30e44323485a9b9d) >> (bVar21 & 0x3f)] =
       ((int)src + -2) - iVar53;
  switch(iVar43) {
  case 0:
    lVar39 = -0x30e4432345000000;
    break;
  case 1:
    lVar39 = -0x30e4432340650000;
    break;
  case 2:
    lVar39 = -0x30e44323405a9d00;
    break;
  case 3:
    uVar27 = uVar27 >> (bVar22 & 0x3f);
    goto LAB_005e3fca;
  default:
    uVar27 = (ulong)((uint)(*(int *)(pBVar10 + uVar48) * -0x61c8864f) >> (bVar23 & 0x1f));
    goto LAB_005e3fca;
  }
  uVar27 = (ulong)(lVar40 * lVar39) >> (bVar22 & 0x3f);
LAB_005e3fca:
  pUVar11[uVar27] = uVar48;
  plVar2 = (long *)((long)src + -1);
  switch(iVar43) {
  case 0:
    lVar40 = -0x30e4432345000000;
    break;
  case 1:
    lVar40 = -0x30e4432340650000;
    break;
  case 2:
    lVar40 = -0x30e44323405a9d00;
    break;
  case 3:
    uVar27 = *plVar2 * -0x30e44323485a9b9d;
    goto LAB_005e401a;
  default:
    uVar27 = (ulong)((uint)(*(int *)plVar2 * -0x61c8864f) >> (bVar23 & 0x1f));
    goto LAB_005e4022;
  }
  uVar27 = lVar40 * *plVar2;
LAB_005e401a:
  uVar27 = uVar27 >> (bVar22 & 0x3f);
LAB_005e4022:
  pUVar11[uVar27] = (int)plVar2 - iVar53;
  uVar27 = uVar30;
  for (; ((uVar30 = uVar27, puVar55 = (ulong *)src, src <= puVar7 && ((int)uVar30 != 0)) &&
         ((int)*src == *(int *)((long)src - uVar30)));
      src = (void *)((long)src + (long)(pBVar47 + 4))) {
    puVar55 = (ulong *)((long)src + 4);
    puVar25 = (ulong *)((long)src + (4 - uVar30));
    puVar50 = puVar55;
    if (puVar55 < puVar3) {
      uVar33 = *puVar55 ^ *puVar25;
      uVar27 = 0;
      if (uVar33 != 0) {
        for (; (uVar33 >> uVar27 & 1) == 0; uVar27 = uVar27 + 1) {
        }
      }
      pBVar47 = (BYTE *)(uVar27 >> 3 & 0x1fffffff);
      if (*puVar25 == *puVar55) {
        puVar50 = (ulong *)((long)src + 0xc);
        puVar25 = (ulong *)((long)src + (0xc - uVar30));
        do {
          if (puVar3 <= puVar50) goto LAB_005e40d7;
          uVar27 = *puVar25;
          uVar33 = *puVar50;
          uVar46 = uVar33 ^ uVar27;
          uVar49 = 0;
          if (uVar46 != 0) {
            for (; (uVar46 >> uVar49 & 1) == 0; uVar49 = uVar49 + 1) {
            }
          }
          pBVar47 = (BYTE *)((long)puVar50 + ((uVar49 >> 3 & 0x1fffffff) - (long)puVar55));
          puVar50 = puVar50 + 1;
          puVar25 = puVar25 + 1;
        } while (uVar27 == uVar33);
      }
    }
    else {
LAB_005e40d7:
      if ((puVar50 < puVar4) && ((int)*puVar25 == (int)*puVar50)) {
        puVar50 = (ulong *)((long)puVar50 + 4);
        puVar25 = (ulong *)((long)puVar25 + 4);
      }
      if ((puVar50 < puVar5) && ((short)*puVar25 == (short)*puVar50)) {
        puVar50 = (ulong *)((long)puVar50 + 2);
        puVar25 = (ulong *)((long)puVar25 + 2);
      }
      if (puVar50 < iEnd) {
        puVar50 = (ulong *)((long)puVar50 + (ulong)((BYTE)*puVar25 == (BYTE)*puVar50));
      }
      pBVar47 = (BYTE *)((long)puVar50 - (long)puVar55);
    }
    switch(iVar43) {
    case 0:
      lVar40 = -0x30e4432345000000;
      break;
    case 1:
      lVar40 = -0x30e4432340650000;
      break;
    case 2:
      lVar40 = -0x30e44323405a9d00;
      break;
    case 3:
      uVar27 = *src * -0x30e44323485a9b9d;
      goto LAB_005e4186;
    default:
      uVar27 = (ulong)((uint)((int)*src * -0x61c8864f) >> (bVar23 & 0x1f));
      goto LAB_005e418e;
    }
    uVar27 = lVar40 * *src;
LAB_005e4186:
    uVar27 = uVar27 >> (bVar22 & 0x3f);
LAB_005e418e:
    UVar24 = (int)src - iVar53;
    pUVar11[uVar27] = UVar24;
    pUVar9[*src * -0x30e44323485a9b9d >> (bVar21 & 0x3f)] = UVar24;
    if (src <= puVar19) {
      puVar55 = (ulong *)seqStore->lit;
      uVar27 = *(ulong *)((long)src + 8);
      *puVar55 = *src;
      puVar55[1] = uVar27;
    }
    psVar35 = seqStore->sequences;
    psVar35->litLength = 0;
    psVar35->offset = 1;
    if ((BYTE *)0xffff < pBVar47 + 1) {
      seqStore->longLengthType = ZSTD_llt_matchLength;
      seqStore->longLengthPos = (U32)((ulong)((long)psVar35 - (long)seqStore->sequencesStart) >> 3);
    }
    psVar35->matchLength = (U16)(pBVar47 + 1);
    seqStore->sequences = psVar35 + 1;
    uVar27 = uVar26;
    uVar26 = uVar30;
  }
LAB_005e4258:
  uVar42 = (uint)uVar30;
  uVar48 = (uint)uVar26;
  if (puVar7 <= puVar55) goto LAB_005e45d4;
  goto LAB_005e3924;
}

Assistant:

static size_t ZSTD_compressBlock_doubleFast_extDict_generic(
        ZSTD_matchState_t* ms, seqStore_t* seqStore, U32 rep[ZSTD_REP_NUM],
        void const* src, size_t srcSize,
        U32 const mls /* template */)
{
    ZSTD_compressionParameters const* cParams = &ms->cParams;
    U32* const hashLong = ms->hashTable;
    U32  const hBitsL = cParams->hashLog;
    U32* const hashSmall = ms->chainTable;
    U32  const hBitsS = cParams->chainLog;
    const BYTE* const istart = (const BYTE*)src;
    const BYTE* ip = istart;
    const BYTE* anchor = istart;
    const BYTE* const iend = istart + srcSize;
    const BYTE* const ilimit = iend - 8;
    const BYTE* const base = ms->window.base;
    const U32   endIndex = (U32)((size_t)(istart - base) + srcSize);
    const U32   lowLimit = ZSTD_getLowestMatchIndex(ms, endIndex, cParams->windowLog);
    const U32   dictStartIndex = lowLimit;
    const U32   dictLimit = ms->window.dictLimit;
    const U32   prefixStartIndex = (dictLimit > lowLimit) ? dictLimit : lowLimit;
    const BYTE* const prefixStart = base + prefixStartIndex;
    const BYTE* const dictBase = ms->window.dictBase;
    const BYTE* const dictStart = dictBase + dictStartIndex;
    const BYTE* const dictEnd = dictBase + prefixStartIndex;
    U32 offset_1=rep[0], offset_2=rep[1];

    DEBUGLOG(5, "ZSTD_compressBlock_doubleFast_extDict_generic (srcSize=%zu)", srcSize);

    /* if extDict is invalidated due to maxDistance, switch to "regular" variant */
    if (prefixStartIndex == dictStartIndex)
        return ZSTD_compressBlock_doubleFast_generic(ms, seqStore, rep, src, srcSize, mls, ZSTD_noDict);

    /* Search Loop */
    while (ip < ilimit) {  /* < instead of <=, because (ip+1) */
        const size_t hSmall = ZSTD_hashPtr(ip, hBitsS, mls);
        const U32 matchIndex = hashSmall[hSmall];
        const BYTE* const matchBase = matchIndex < prefixStartIndex ? dictBase : base;
        const BYTE* match = matchBase + matchIndex;

        const size_t hLong = ZSTD_hashPtr(ip, hBitsL, 8);
        const U32 matchLongIndex = hashLong[hLong];
        const BYTE* const matchLongBase = matchLongIndex < prefixStartIndex ? dictBase : base;
        const BYTE* matchLong = matchLongBase + matchLongIndex;

        const U32 curr = (U32)(ip-base);
        const U32 repIndex = curr + 1 - offset_1;   /* offset_1 expected <= curr +1 */
        const BYTE* const repBase = repIndex < prefixStartIndex ? dictBase : base;
        const BYTE* const repMatch = repBase + repIndex;
        size_t mLength;
        hashSmall[hSmall] = hashLong[hLong] = curr;   /* update hash table */

        if ((((U32)((prefixStartIndex-1) - repIndex) >= 3) /* intentional underflow : ensure repIndex doesn't overlap dict + prefix */
            & (offset_1 < curr+1 - dictStartIndex)) /* note: we are searching at curr+1 */
          && (MEM_read32(repMatch) == MEM_read32(ip+1)) ) {
            const BYTE* repMatchEnd = repIndex < prefixStartIndex ? dictEnd : iend;
            mLength = ZSTD_count_2segments(ip+1+4, repMatch+4, iend, repMatchEnd, prefixStart) + 4;
            ip++;
            ZSTD_storeSeq(seqStore, (size_t)(ip-anchor), anchor, iend, 0, mLength-MINMATCH);
        } else {
            if ((matchLongIndex > dictStartIndex) && (MEM_read64(matchLong) == MEM_read64(ip))) {
                const BYTE* const matchEnd = matchLongIndex < prefixStartIndex ? dictEnd : iend;
                const BYTE* const lowMatchPtr = matchLongIndex < prefixStartIndex ? dictStart : prefixStart;
                U32 offset;
                mLength = ZSTD_count_2segments(ip+8, matchLong+8, iend, matchEnd, prefixStart) + 8;
                offset = curr - matchLongIndex;
                while (((ip>anchor) & (matchLong>lowMatchPtr)) && (ip[-1] == matchLong[-1])) { ip--; matchLong--; mLength++; }   /* catch up */
                offset_2 = offset_1;
                offset_1 = offset;
                ZSTD_storeSeq(seqStore, (size_t)(ip-anchor), anchor, iend, offset + ZSTD_REP_MOVE, mLength-MINMATCH);

            } else if ((matchIndex > dictStartIndex) && (MEM_read32(match) == MEM_read32(ip))) {
                size_t const h3 = ZSTD_hashPtr(ip+1, hBitsL, 8);
                U32 const matchIndex3 = hashLong[h3];
                const BYTE* const match3Base = matchIndex3 < prefixStartIndex ? dictBase : base;
                const BYTE* match3 = match3Base + matchIndex3;
                U32 offset;
                hashLong[h3] = curr + 1;
                if ( (matchIndex3 > dictStartIndex) && (MEM_read64(match3) == MEM_read64(ip+1)) ) {
                    const BYTE* const matchEnd = matchIndex3 < prefixStartIndex ? dictEnd : iend;
                    const BYTE* const lowMatchPtr = matchIndex3 < prefixStartIndex ? dictStart : prefixStart;
                    mLength = ZSTD_count_2segments(ip+9, match3+8, iend, matchEnd, prefixStart) + 8;
                    ip++;
                    offset = curr+1 - matchIndex3;
                    while (((ip>anchor) & (match3>lowMatchPtr)) && (ip[-1] == match3[-1])) { ip--; match3--; mLength++; } /* catch up */
                } else {
                    const BYTE* const matchEnd = matchIndex < prefixStartIndex ? dictEnd : iend;
                    const BYTE* const lowMatchPtr = matchIndex < prefixStartIndex ? dictStart : prefixStart;
                    mLength = ZSTD_count_2segments(ip+4, match+4, iend, matchEnd, prefixStart) + 4;
                    offset = curr - matchIndex;
                    while (((ip>anchor) & (match>lowMatchPtr)) && (ip[-1] == match[-1])) { ip--; match--; mLength++; }   /* catch up */
                }
                offset_2 = offset_1;
                offset_1 = offset;
                ZSTD_storeSeq(seqStore, (size_t)(ip-anchor), anchor, iend, offset + ZSTD_REP_MOVE, mLength-MINMATCH);

            } else {
                ip += ((ip-anchor) >> kSearchStrength) + 1;
                continue;
        }   }

        /* move to next sequence start */
        ip += mLength;
        anchor = ip;

        if (ip <= ilimit) {
            /* Complementary insertion */
            /* done after iLimit test, as candidates could be > iend-8 */
            {   U32 const indexToInsert = curr+2;
                hashLong[ZSTD_hashPtr(base+indexToInsert, hBitsL, 8)] = indexToInsert;
                hashLong[ZSTD_hashPtr(ip-2, hBitsL, 8)] = (U32)(ip-2-base);
                hashSmall[ZSTD_hashPtr(base+indexToInsert, hBitsS, mls)] = indexToInsert;
                hashSmall[ZSTD_hashPtr(ip-1, hBitsS, mls)] = (U32)(ip-1-base);
            }

            /* check immediate repcode */
            while (ip <= ilimit) {
                U32 const current2 = (U32)(ip-base);
                U32 const repIndex2 = current2 - offset_2;
                const BYTE* repMatch2 = repIndex2 < prefixStartIndex ? dictBase + repIndex2 : base + repIndex2;
                if ( (((U32)((prefixStartIndex-1) - repIndex2) >= 3)   /* intentional overflow : ensure repIndex2 doesn't overlap dict + prefix */
                    & (offset_2 < current2 - dictStartIndex))
                  && (MEM_read32(repMatch2) == MEM_read32(ip)) ) {
                    const BYTE* const repEnd2 = repIndex2 < prefixStartIndex ? dictEnd : iend;
                    size_t const repLength2 = ZSTD_count_2segments(ip+4, repMatch2+4, iend, repEnd2, prefixStart) + 4;
                    U32 const tmpOffset = offset_2; offset_2 = offset_1; offset_1 = tmpOffset;   /* swap offset_2 <=> offset_1 */
                    ZSTD_storeSeq(seqStore, 0, anchor, iend, 0, repLength2-MINMATCH);
                    hashSmall[ZSTD_hashPtr(ip, hBitsS, mls)] = current2;
                    hashLong[ZSTD_hashPtr(ip, hBitsL, 8)] = current2;
                    ip += repLength2;
                    anchor = ip;
                    continue;
                }
                break;
    }   }   }

    /* save reps for next block */
    rep[0] = offset_1;
    rep[1] = offset_2;

    /* Return the last literals size */
    return (size_t)(iend - anchor);
}